

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O3

FSerializer *
SerializePointer<FPolyObj>
          (FSerializer *arc,char *key,FPolyObj **value,FPolyObj **defval,FPolyObj *base)

{
  uint uVar1;
  FPolyObj *pFVar2;
  int64_t vv;
  long local_30;
  
  if (base == (FPolyObj *)0x0) {
    __assert_fail("base != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                  ,0x59f,
                  "FSerializer &SerializePointer(FSerializer &, const char *, T *&, T **, T *) [T = FPolyObj]"
                 );
  }
  if (arc->r == (FReader *)0x0) {
    uVar1 = (arc->w->mInObject).Count;
    if (((uVar1 != 0) && (defval != (FPolyObj **)0x0)) &&
       ((arc->w->mInObject).Array[uVar1 - 1] != false)) {
      pFVar2 = *value;
      if (pFVar2 == *defval) {
        return arc;
      }
      goto LAB_0047ad1d;
    }
  }
  pFVar2 = *value;
LAB_0047ad1d:
  if (pFVar2 == (FPolyObj *)0x0) {
    local_30 = -1;
  }
  else {
    local_30 = ((long)pFVar2 - (long)base >> 4) * -0x1111111111111111;
  }
  Serialize(arc,key,&local_30,(int64_t *)0x0);
  pFVar2 = base + local_30;
  if (local_30 < 0) {
    pFVar2 = (FPolyObj *)0x0;
  }
  *value = pFVar2;
  return arc;
}

Assistant:

FSerializer &SerializePointer(FSerializer &arc, const char *key, T *&value, T **defval, T *base)
{
	assert(base != nullptr);
	if (arc.isReading() || !arc.w->inObject() || defval == nullptr || value != *defval)
	{
		int64_t vv = value == nullptr ? -1 : value - base;
		Serialize(arc, key, vv, nullptr);
		value = vv < 0 ? nullptr : base + vv;
	}
	return arc;
}